

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BibIndexer.h
# Opt level: O3

void __thiscall
BibEntryIssue::BibEntryIssue(BibEntryIssue *this,TSRange range,Severity sev,int code,string *msg)

{
  pointer pcVar1;
  
  (this->super_Reflectable)._vptr_Reflectable = (_func_int **)&PTR_reflect_00216cd8;
  (this->range).start_point.row = range.start_point.row;
  (this->range).start_point.column = range.start_point.column;
  (this->range).end_point.row = range.end_point.row;
  (this->range).end_point.column = range.end_point.column;
  (this->range).start_byte = range.start_byte;
  (this->range).end_byte = range.end_byte;
  this->severity = sev;
  this->code = code;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + msg->_M_string_length);
  (this->source)._M_dataplus._M_p = (pointer)&(this->source).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->source,"biber","");
  return;
}

Assistant:

BibEntryIssue (TSRange range, Severity sev, int code, string msg) : range { range }, severity { sev }, code { code }, message { msg } {}